

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Print
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  TPZNodeRep<3,_pztopology::TPZTriangle>::Print((TPZNodeRep<3,_pztopology::TPZTriangle> *)this,out);
  std::operator<<(out,"Neighbours/transformations used for mapping the sides :\n");
  iVar3 = 3;
  for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0x18) {
    poVar2 = std::operator<<(out,"Side: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
    poVar2 = std::operator<<(poVar2," El/side: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2,":");
    iVar1 = *(int *)((long)&this->fNeighbours[0].fSide + lVar5);
    iVar4 = iVar1;
    if (*(long *)((long)&this->fNeighbours[0].fGeoElIndex + lVar5) == -1) {
      iVar4 = -1;
    }
    if (iVar1 == -1) {
      iVar4 = iVar1;
    }
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
    std::operator<<(poVar2,'\n');
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Print(std::ostream &out) const
{
	TGeo::Print(out);
	out << "Neighbours/transformations used for mapping the sides :\n";
	int is;
	for(is=TGeo::NNodes; is<TGeo::NSides; is++)
	{
        out << "Side: " << is << " El/side: " << fNeighbours[is-TGeo::NNodes].ElementIndex() << ":" <<
        fNeighbours[is-TGeo::NNodes].Side() << '\n';
	}
}